

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaDevice.cpp
# Opt level: O3

void __thiscall xmrig::CudaDevice::toJSON(CudaDevice *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t value;
  undefined8 uVar4;
  Value fanSpeed;
  Value health;
  NvmlHealth data;
  Data local_a8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_90;
  Data local_88;
  Data local_78;
  Data local_68;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  String::toJSON((String *)&local_a8.s,(Document *)&this->m_name);
  local_68.s.str = (Ch *)0x40500000018c30b;
  local_68.n = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,allocator);
  PciTopology::toString((PciTopology *)&local_88.s);
  String::toJSON((String *)&local_a8.s,(Document *)&local_88.s);
  local_68.s.str = (Ch *)0x40500000018c310;
  local_68.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,allocator);
  if (local_88.n.i64 != 0) {
    operator_delete__((void *)local_88.n);
  }
  uVar2 = CudaLib::deviceUint(this->m_ctx,DeviceSmx);
  local_a8.s.str = (Ch *)0x40500000018d52b;
  local_a8.n = (Number)0x3;
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_68._0_4_ = uVar2;
  local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  uVar2 = CudaLib::deviceUint(this->m_ctx,DeviceArchMajor);
  local_90 = out;
  uVar3 = CudaLib::deviceUint(this->m_ctx,DeviceArchMinor);
  local_68._0_4_ = uVar3 + uVar2 * 10;
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_a8.s.str = (Ch *)0x40500000018d52f;
  local_a8.n = (Number)0x4;
  local_68.s.str = (Ch *)((ulong)(-1 < local_68._0_4_) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_90,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  local_40.s = "global_mem";
  local_40.length = 10;
  value = CudaLib::deviceUlong(this->m_ctx,DeviceMemoryTotal);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(local_90,&local_40,value,allocator);
  uVar2 = CudaLib::deviceUint(this->m_ctx,DeviceClockRate);
  local_68.n = (Number)((ulong)uVar2 / 1000);
  local_a8.s.str = (Ch *)0x40500000018d557;
  local_a8.n = (Number)0x5;
  local_68.s.str = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_90,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  uVar2 = CudaLib::deviceUint(this->m_ctx,DeviceMemoryClockRate);
  local_68.n = (Number)((ulong)uVar2 / 1000);
  local_a8.s.str = (Ch *)0x40500000018d534;
  local_a8.n = (Number)0xc;
  local_68.s.str = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_90,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  if (this->m_nvmlDevice != (nvmlDevice_t)0x0) {
    NvmlLib::health((NvmlHealth *)&local_68.s,this->m_nvmlDevice);
    local_78.n = (Number)0x0;
    local_78.s.str = (Ch *)0x3000000000000;
    local_a8._4_1_ = '\0';
    local_a8._5_1_ = '\0';
    local_a8._6_1_ = '\0';
    local_a8._7_1_ = '\0';
    local_a8._0_4_ = local_44;
    local_88.s.str = (Ch *)0x40500000018d541;
    local_88.n = (Number)0xb;
    local_a8.s.str = (Ch *)((ulong)(-1 < (int)local_44) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,allocator);
    local_a8._4_1_ = '\0';
    local_a8._5_1_ = '\0';
    local_a8._6_1_ = '\0';
    local_a8._7_1_ = '\0';
    local_a8._0_4_ = local_48;
    local_88.s.str = (Ch *)0x40500000018d54d;
    local_88.n = (Number)0x5;
    local_a8.s.str = (Ch *)((ulong)(-1 < (int)local_48) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,allocator);
    local_a8._4_1_ = '\0';
    local_a8._5_1_ = '\0';
    local_a8._6_1_ = '\0';
    local_a8._7_1_ = '\0';
    local_a8._0_4_ = local_50;
    local_88.s.str = (Ch *)0x40500000018d557;
    local_88.n = (Number)0x5;
    local_a8.s.str = (Ch *)((ulong)(-1 < (int)local_50) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,allocator);
    local_a8._4_1_ = '\0';
    local_a8._5_1_ = '\0';
    local_a8._6_1_ = '\0';
    local_a8._7_1_ = '\0';
    local_a8._0_4_ = local_4c;
    local_88.s.str = (Ch *)0x40500000018d553;
    local_88.n = (Number)0x9;
    local_a8.s.str = (Ch *)((ulong)(-1 < (int)local_4c) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,allocator);
    uVar1 = local_68.s.str;
    local_88.n = (Number)0x0;
    local_88.s.str = (Ch *)0x4000000000000;
    if (local_68.n.i64 != (Number)local_68.s.str) {
      uVar4 = local_68.n;
      do {
        local_a8._4_1_ = '\0';
        local_a8._5_1_ = '\0';
        local_a8._6_1_ = '\0';
        local_a8._7_1_ = '\0';
        local_a8._0_4_ = *(uint *)uVar4;
        local_a8.s.str = (Ch *)((ulong)(-1 < (int)*(uint *)uVar4) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_88.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_a8.s,allocator);
        uVar4 = uVar4 + 4;
      } while (uVar4 != uVar1);
    }
    local_a8.s.str = (Ch *)0x40500000018d55d;
    local_a8.n = (Number)0x9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,allocator);
    local_a8.s.str = (Ch *)0x40500000018d567;
    local_a8.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(local_90,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_a8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,allocator);
    if (local_68.n.i64 != 0) {
      operator_delete((void *)local_68.n);
    }
  }
  return;
}

Assistant:

void xmrig::CudaDevice::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    out.AddMember("name",           name().toJSON(doc), allocator);
    out.AddMember("bus_id",         topology().toString().toJSON(doc), allocator);
    out.AddMember("smx",            smx(), allocator);
    out.AddMember("arch",           arch(), allocator);
    out.AddMember("global_mem",     static_cast<uint64_t>(globalMemSize()), allocator);
    out.AddMember("clock",          clock(), allocator);
    out.AddMember("memory_clock",   memoryClock(), allocator);

#   ifdef XMRIG_FEATURE_NVML
    if (m_nvmlDevice) {
        auto data = NvmlLib::health(m_nvmlDevice);

        Value health(kObjectType);
        health.AddMember("temperature", data.temperature, allocator);
        health.AddMember("power",       data.power, allocator);
        health.AddMember("clock",       data.clock, allocator);
        health.AddMember("mem_clock",   data.memClock, allocator);

        Value fanSpeed(kArrayType);
        for (auto speed : data.fanSpeed) {
            fanSpeed.PushBack(speed, allocator);
        }
        health.AddMember("fan_speed", fanSpeed, allocator);

        out.AddMember("health", health, allocator);
    }
#   endif
}